

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void setPendingFd(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  UnixUnusedFd *p;
  unixInodeInfo *pInode;
  unixFile *pFile_local;
  
  puVar1 = pFile->pInode;
  pUVar2 = pFile->pUnused;
  pUVar2->pNext = puVar1->pUnused;
  puVar1->pUnused = pUVar2;
  pFile->h = -1;
  pFile->pUnused = (UnixUnusedFd *)0x0;
  return;
}

Assistant:

static void setPendingFd(unixFile *pFile){
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *p = pFile->pUnused;
  p->pNext = pInode->pUnused;
  pInode->pUnused = p;
  pFile->h = -1;
  pFile->pUnused = 0;
}